

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::CeilCase::compare(CeilCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  deUint32 aBits;
  uint uVar5;
  float fVar6;
  ostream *poVar7;
  uint uVar8;
  int iVar9;
  ostringstream *poVar10;
  int iVar11;
  float fVar12;
  int iVar13;
  ulong uVar14;
  deUint32 bBits;
  float fVar15;
  float fVar16;
  float fVar17;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (PVar1 - PRECISION_MEDIUMP < 2) {
    if ((int)uVar5 < 1) {
      return true;
    }
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar14 = 0;
    do {
      local_34.value = ceilf(*(float *)((long)pvVar3 + uVar14 * 4));
      fVar15 = *(float *)((long)pvVar4 + uVar14 * 4);
      if (PVar1 == PRECISION_HIGHP) {
LAB_0046b4b4:
        fVar12 = local_34.value - (int)fVar15;
        if ((uint)local_34.value < (uint)fVar15) {
          fVar12 = (float)-((int)local_34.value - (int)fVar15);
        }
      }
      else if ((fVar15 != 0.0) || (NAN(fVar15))) {
        if ((local_34.value != 0.0) || (NAN(local_34.value))) goto LAB_0046b4b4;
        fVar12 = ABS(fVar15);
      }
      else {
        fVar12 = ABS(local_34.value);
      }
      if (fVar12 != 0.0) {
        poVar10 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"Expected [",10);
        poVar7 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = ",4);
        poVar7 = Functional::operator<<(poVar7,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ULP diff ",0xf);
LAB_0046b724:
        local_40.value = (deUint64)(uint)fVar12;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar7);
        return false;
      }
      uVar14 = uVar14 + 1;
    } while (uVar5 != uVar14);
  }
  else {
    uVar8 = -1 << (0x17 - (&DAT_0096a1bc)[(ulong)PVar1 * 4] & 0x1f);
    if ((int)uVar5 < 1) {
      return true;
    }
    fVar12 = (float)~uVar8;
    fVar15 = (float)(uVar8 & 0x7fffff ^ 0x3fffffff) + -1.0;
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar14 = 0;
    do {
      fVar17 = *(float *)((long)pvVar3 + uVar14 * 4);
      fVar6 = *(float *)((long)pvVar4 + uVar14 * 4);
      fVar16 = ceilf(fVar17 - fVar15);
      iVar11 = (int)fVar16;
      fVar17 = ceilf(fVar17 + fVar15);
      iVar13 = (int)fVar17;
      if (iVar11 <= iVar13) {
        iVar9 = iVar11;
        do {
          fVar17 = (float)iVar9;
          if ((fVar6 != 0.0) || (NAN(fVar6))) {
            fVar16 = ABS(fVar6);
            if (iVar9 != 0) {
              fVar16 = (float)((int)fVar17 - (int)fVar6);
              if ((uint)fVar17 < (uint)fVar6) {
                fVar16 = (float)-((int)fVar17 - (int)fVar6);
              }
            }
          }
          else {
            fVar16 = ABS(fVar17);
          }
          if ((uint)fVar16 <= (uint)fVar12) goto LAB_0046b60c;
          iVar9 = iVar9 + 1;
        } while (iVar9 <= iVar13);
      }
      if ((0 < iVar11) || (iVar13 < 0)) {
LAB_0046b621:
        poVar10 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"Expected [",10);
        poVar7 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = [",5);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] with ULP threshold ",0x15);
        goto LAB_0046b724;
      }
      fVar6 = (float)((int)fVar6 + -0x80000000);
      fVar17 = (float)-(int)fVar6;
      if (0 < (int)fVar6) {
        fVar17 = fVar6;
      }
      if ((uint)fVar12 < (uint)fVar17) goto LAB_0046b621;
LAB_0046b60c:
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar5);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatCeil(in0);

				const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(deFloatCeil(in0-eps));
				const int		maxRes		= int(deFloatCeil(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk && de::inRange(0, minRes, maxRes))
				{
					// Allow -0 as well.
					const int ulpDiff = de::abs((int)tcu::Float32(out0).bits() - (int)0x80000000u);
					anyOk = ((deUint32)ulpDiff <= maxUlpDiff);
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}